

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

Database_Result * __thiscall
Database::RawQuery(Database_Result *__return_storage_ptr__,Database *this,char *query,
                  bool tx_control)

{
  size_t *psVar1;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var2;
  int iVar3;
  undefined4 uVar4;
  _List_node_base *p_Var5;
  size_type __new_size;
  mapped_type *pmVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  char *pcVar9;
  undefined7 in_register_00000009;
  long lVar10;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  string *db;
  long lVar11;
  char *pcVar12;
  Database *pDVar13;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var14;
  string *host;
  _List_node_base *p_Var15;
  uint uVar16;
  ulong uVar17;
  variant rescell;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  resrow;
  allocator<char> local_109;
  long local_108;
  Database_Result *local_100;
  _List_node_base *local_f8;
  string *local_f0;
  string *local_e8;
  size_t local_e0;
  char *local_d8;
  undefined4 local_cc;
  string local_c8;
  undefined1 local_a8 [17];
  undefined7 uStack_97;
  _List_node_base *p_Stack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  bool local_78;
  bool bStack_77;
  bool bStack_76;
  bool bStack_75;
  bool bStack_74;
  undefined3 uStack_73;
  var_type local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  if (this->connected == false) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar8[1] = "Not connected to database.";
    *puVar8 = &PTR__exception_001d1538;
    __cxa_throw(puVar8,&Database_QueryFailed::typeinfo,std::exception::~exception);
  }
  local_e0 = strlen(query);
  (__return_storage_ptr__->
  super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
  ).
  super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
  ).
  super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           ).
           super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           ).
           super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
  local_100 = __return_storage_ptr__;
  if (this->engine == SQLite) {
    iVar3 = sqlite3_exec(((this->impl)._M_t.
                          super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                          .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0,
                         query,sqlite_callback,this,0);
    if (iVar3 == 0) {
      std::
      vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
      ::operator=(&local_100->
                   super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                  ,&(this->callbackdata).
                    super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                 );
      local_100->error = (this->callbackdata).error;
      local_100->affected_rows = (this->callbackdata).affected_rows;
      p_Var14 = &((this->callbackdata).
                  super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                  .
                  super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_h;
      p_Var2 = &((this->callbackdata).
                 super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                 .
                 super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_h;
      this_00 = p_Var14;
      if (p_Var2 == p_Var14) {
        return local_100;
      }
      do {
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != p_Var2);
      (this->callbackdata).
      super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
      .
      super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var14;
      return local_100;
    }
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
    pcVar9 = (char *)sqlite3_errmsg(((this->impl)._M_t.
                                     super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                     .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)
                                    ->field_0);
  }
  else {
    local_cc = (undefined4)CONCAT71(in_register_00000009,tx_control);
    local_d8 = query;
    if (this->engine == MySQL) {
      local_f0 = &this->host;
      local_e8 = &this->db;
      local_f8 = (_List_node_base *)&this->transaction_log;
      lVar11 = 0;
LAB_0012f317:
      pcVar9 = local_d8;
      iVar3 = mysql_real_query(((this->impl)._M_t.
                                super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                               field_0,local_d8,local_e0);
      if (iVar3 == 0) {
        if ((this->in_transaction == true && (char)local_cc == '\0') &&
           (iVar3 = strncmp(pcVar9,"SELECT",6), iVar3 != 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a8,pcVar9,(allocator<char> *)&local_68);
          p_Var5 = (_List_node_base *)operator_new(0x30);
          p_Var5[1]._M_next = p_Var5 + 2;
          p_Var15 = (_List_node_base *)(local_a8 + 0x10);
          if ((_List_node_base *)local_a8._0_8_ == p_Var15) {
            p_Var5[2]._M_next = (_List_node_base *)CONCAT71(uStack_97,local_a8[0x10]);
            p_Var5[2]._M_prev = p_Stack_90;
          }
          else {
            p_Var5[1]._M_next = (_List_node_base *)local_a8._0_8_;
            p_Var5[2]._M_next = (_List_node_base *)CONCAT71(uStack_97,local_a8[0x10]);
          }
          p_Var5[1]._M_prev = (_List_node_base *)local_a8._8_8_;
          local_a8._8_8_ = (_List_node_base *)0x0;
          local_a8[0x10] = 0;
          local_a8._0_8_ = p_Var15;
          std::__detail::_List_node_base::_M_hook(p_Var5);
          psVar1 = &(this->transaction_log).
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          if ((_List_node_base *)local_a8._0_8_ != p_Var15) {
            operator_delete((void *)local_a8._0_8_,CONCAT71(uStack_97,local_a8[0x10]) + 1);
          }
        }
        uVar4 = mysql_field_count(((this->impl)._M_t.
                                   super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                   .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                                  field_0);
        local_f0 = (string *)CONCAT44(local_f0._4_4_,uVar4);
        lVar11 = mysql_store_result(((this->impl)._M_t.
                                     super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                     .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)
                                    ->field_0);
        if (lVar11 == 0) {
          if ((int)local_f0 != 0) {
            puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
            uVar7 = mysql_error(((this->impl)._M_t.
                                 super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                 .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                                field_0);
            puVar8[1] = uVar7;
            *puVar8 = &PTR__exception_001d1538;
            __cxa_throw(puVar8,&Database_QueryFailed::typeinfo,std::exception::~exception);
          }
          iVar3 = mysql_affected_rows(((this->impl)._M_t.
                                       super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                       .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl
                                      )->field_0);
          local_100->affected_rows = iVar3;
        }
        else {
          puVar8 = (undefined8 *)mysql_fetch_fields(lVar11);
          local_e8 = (string *)((ulong)local_f0 & 0xffffffff);
          if (0 < (int)local_f0) {
            lVar10 = 0;
            do {
              if (*(long *)((long)puVar8 + lVar10) == 0) {
                puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
                puVar8[1] = "libMySQL critical failure!";
                *puVar8 = &PTR__exception_001d1538;
                __cxa_throw(puVar8,&Database_QueryFailed::typeinfo,std::exception::~exception);
              }
              lVar10 = lVar10 + 0x80;
            } while ((long)local_e8 << 7 != lVar10);
          }
          __new_size = mysql_num_rows(lVar11);
          std::
          vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
          ::resize(&local_100->
                    super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                   ,__new_size);
          local_e0 = lVar11;
          local_d8 = (char *)puVar8;
          local_108 = mysql_fetch_row(lVar11);
          local_f8 = (_List_node_base *)0x0;
          while (local_108 != 0) {
            local_68._M_buckets = &local_68._M_single_bucket;
            local_68._M_bucket_count = 1;
            local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_68._M_element_count = 0;
            local_68._M_rehash_policy._M_max_load_factor = 1.0;
            local_68._M_rehash_policy._M_next_resize = 0;
            local_68._M_single_bucket = (__node_base_ptr)0x0;
            if (0 < (int)local_f0) {
              uVar17 = 0;
              pcVar9 = local_d8;
              do {
                util::variant::variant((variant *)local_a8);
                iVar3 = *(int *)((long)pcVar9 + 0x70);
                if (((iVar3 < 10 && iVar3 != 7) || (iVar3 == 0xf6)) || (iVar3 == 0xd)) {
                  pcVar12 = *(char **)(local_108 + uVar17 * 8);
                  if (pcVar12 == (char *)0x0) {
                    util::variant::operator=((variant *)local_a8,0);
                  }
                  else {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_c8,pcVar12,&local_109);
                    iVar3 = util::to_int(&local_c8);
                    util::variant::operator=((variant *)local_a8,iVar3);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                      operator_delete(local_c8._M_dataplus._M_p,
                                      local_c8.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                else {
                  pcVar12 = *(char **)(local_108 + uVar17 * 8);
                  if (pcVar12 == (char *)0x0) {
                    pcVar12 = "";
                  }
                  util::variant::operator=((variant *)local_a8,pcVar12);
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_c8,*(char **)pcVar9,&local_109);
                pmVar6 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)&local_68,&local_c8);
                *(undefined8 *)pmVar6 = local_a8._0_8_;
                pmVar6->val_float = (double)local_a8._8_8_;
                std::__cxx11::string::_M_assign((string *)&pmVar6->val_string);
                pmVar6->type = local_70;
                pmVar6->val_bool = local_78;
                pmVar6->cache_val[0] = bStack_77;
                pmVar6->cache_val[1] = bStack_76;
                pmVar6->cache_val[2] = bStack_75;
                pmVar6->cache_val[3] = bStack_74;
                *(undefined3 *)&pmVar6->field_0x35 = uStack_73;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_97,local_a8[0x10]) != &local_88) {
                  operator_delete((undefined1 *)CONCAT71(uStack_97,local_a8[0x10]),
                                  local_88._M_allocated_capacity + 1);
                }
                uVar17 = uVar17 + 1;
                pcVar9 = (char *)((long)pcVar9 + 0x80);
              } while (local_e8 != (string *)uVar17);
            }
            p_Var14 = &(local_100->
                       super_vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                       ).
                       super__Vector_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(int)local_f8]._M_h;
            if (&local_68 != p_Var14) {
              std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,util::variant>,std::allocator<std::pair<std::__cxx11::string_const,util::variant>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::
              _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,util::variant>,std::allocator<std::pair<std::__cxx11::string_const,util::variant>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,util::variant>,std::allocator<std::pair<std::__cxx11::string_const,util::variant>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)p_Var14,&local_68);
            }
            local_f8 = (_List_node_base *)(ulong)((int)local_f8 + 1);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&local_68);
            local_108 = mysql_fetch_row(local_e0);
          }
          mysql_free_result(local_e0);
        }
        return local_100;
      }
      iVar3 = mysql_errno(((this->impl)._M_t.
                           super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                           .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0);
      if (((iVar3 != 0x4b5) && (iVar3 != 0x7dd)) && (iVar3 != 0x7d6)) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
        uVar7 = mysql_error(((this->impl)._M_t.
                             super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                             .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0
                           );
        puVar8[1] = uVar7;
        *puVar8 = &PTR__exception_001d1538;
        __cxa_throw(puVar8,&Database_QueryFailed::typeinfo,std::exception::~exception);
      }
      uVar17 = 1;
      db = local_e8;
      host = local_f0;
      local_108 = lVar11;
      do {
        Console::Wrn("Connection to database lost! Attempting to reconnect... (Attempt %i / 10)",
                     uVar17);
        pDVar13 = this;
        Close(this);
        util::sleep((uint)pDVar13);
        Connect(this,this->engine,host,(unsigned_short)this->port,&this->user,&this->pass,db);
        if (this->connected != false) {
          lVar11 = local_108;
          if (this->in_transaction != true) goto LAB_0012f317;
          iVar3 = mysql_real_query(((this->impl)._M_t.
                                    super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                    .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                                   field_0,"START TRANSACTION",0x11);
          if (iVar3 == 0) {
            p_Var15 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_f8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            lVar11 = local_108;
            if (p_Var15 == local_f8) goto LAB_0012f317;
            while( true ) {
              iVar3 = mysql_real_query(((this->impl)._M_t.
                                        super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                        .super__Head_base<0UL,_Database::impl__*,_false>.
                                       _M_head_impl)->field_0,p_Var15[1]._M_next,p_Var15[1]._M_prev)
              ;
              db = local_e8;
              if (iVar3 == 0) {
                local_108 = mysql_use_result(((this->impl)._M_t.
                                              super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                              .super__Head_base<0UL,_Database::impl__*,_false>.
                                             _M_head_impl)->field_0);
              }
              iVar3 = mysql_errno(((this->impl)._M_t.
                                   super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                   .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                                  field_0);
              if (iVar3 != 0) break;
              if (local_108 != 0) {
                mysql_free_result(local_108);
              }
              p_Var15 = p_Var15->_M_next;
              lVar11 = 0;
              local_108 = 0;
              if (p_Var15 == local_f8) goto LAB_0012f317;
            }
            host = local_f0;
            if (((iVar3 != 0x4b5) && (iVar3 != 0x7d6)) && (iVar3 != 0x7dd)) {
              uVar7 = mysql_error(((this->impl)._M_t.
                                   super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                   .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                                  field_0);
              Console::Err("Error during recovery: %s",uVar7);
              Console::Err("Halting server.");
              goto LAB_0012f929;
            }
          }
          else {
            iVar3 = mysql_errno(((this->impl)._M_t.
                                 super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                 .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                                field_0);
            if (((iVar3 != 0x4b5) && (iVar3 != 0x7dd)) && (iVar3 != 0x7d6)) {
              uVar7 = mysql_error(((this->impl)._M_t.
                                   super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>
                                   .super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->
                                  field_0);
              Console::Err("Error during recovery: %s",uVar7);
              Console::Err("Halting server.");
              goto LAB_0012f929;
            }
          }
        }
        uVar16 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar16;
        if (10 < (int)uVar16) {
          Console::Err("Could not re-connect to database. Halting server.");
LAB_0012f929:
          std::terminate();
        }
      } while( true );
    }
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
    pcVar9 = "Unknown database engine";
  }
  puVar8[1] = pcVar9;
  *puVar8 = &PTR__exception_001d1538;
  __cxa_throw(puVar8,&Database_QueryFailed::typeinfo,std::exception::~exception);
}

Assistant:

Database_Result Database::RawQuery(const char* query, bool tx_control)
{
	if (!this->connected)
	{
		throw Database_QueryFailed("Not connected to database.");
	}

	std::size_t query_length = std::strlen(query);

	Database_Result result;

#ifdef DATABASE_DEBUG
	Console::Dbg("%s", query);
#endif // DATABASE_DEBUG

	switch (this->engine)
	{
#ifdef DATABASE_MYSQL
		case MySQL:
		{
			MYSQL_RES* mresult = nullptr;
			MYSQL_FIELD* fields = nullptr;
			int num_fields = 0;

			exec_query:
			if (mysql_real_query(this->impl->mysql_handle, query, query_length) != 0)
			{
				int myerr = mysql_errno(this->impl->mysql_handle);
				int recovery_attempt = 0;

				if (myerr == CR_SERVER_GONE_ERROR || myerr == CR_SERVER_LOST || myerr == ER_LOCK_WAIT_TIMEOUT)
				{
					server_gone:

					if (++recovery_attempt > 10)
					{
						Console::Err("Could not re-connect to database. Halting server.");
						std::terminate();
					}

					Console::Wrn("Connection to database lost! Attempting to reconnect... (Attempt %i / 10)", recovery_attempt);
					this->Close();
					util::sleep(2.0 * recovery_attempt);

					try
					{
						this->Connect(this->engine, this->host, this->port, this->user, this->pass, this->db);
					}
					catch (const Database_OpenFailed& e)
					{
						Console::Err("Connection failed: %s", e.error());
					}

					if (!this->connected)
					{
						goto server_gone;
					}

					if (this->in_transaction)
					{
#ifdef DEBUG
						Console::Dbg("Replaying %i queries.", this->transaction_log.size());
#endif // DEBUG

						if (mysql_real_query(this->impl->mysql_handle, "START TRANSACTION", std::strlen("START TRANSACTION")) != 0)
						{
							int myerr = mysql_errno(this->impl->mysql_handle);

							if (myerr == CR_SERVER_GONE_ERROR || myerr == CR_SERVER_LOST || myerr == ER_LOCK_WAIT_TIMEOUT)
							{
								goto server_gone;
							}
							else
							{
								Console::Err("Error during recovery: %s", mysql_error(this->impl->mysql_handle));
								Console::Err("Halting server.");
								std::terminate();
							}
						}

						for (const std::string& q : this->transaction_log)
						{
#ifdef DATABASE_DEBUG
							Console::Dbg("%s", q.c_str());
#endif // DATABASE_DEBUG
							int myerr = 0;
							int query_result = mysql_real_query(this->impl->mysql_handle, q.c_str(), q.length());

							if (query_result == 0)
							{
								mresult = mysql_use_result(this->impl->mysql_handle);
							}

							myerr = mysql_errno(this->impl->mysql_handle);

							if (myerr == CR_SERVER_GONE_ERROR || myerr == CR_SERVER_LOST || myerr == ER_LOCK_WAIT_TIMEOUT)
							{
								goto server_gone;
							}
							else if (myerr)
							{
								Console::Err("Error during recovery: %s", mysql_error(this->impl->mysql_handle));
								Console::Err("Halting server.");
								std::terminate();
							}
							else
							{
								if (mresult)
								{
									mysql_free_result(mresult);
									mresult = nullptr;
								}
							}
						}
					}

					goto exec_query;
				}
				else
				{
					throw Database_QueryFailed(mysql_error(this->impl->mysql_handle));
				}
			}

			if (this->in_transaction && !tx_control)
			{
				using namespace std;

				if (strncmp(query, "SELECT", 6) != 0)
					this->transaction_log.emplace_back(std::string(query));
			}

			num_fields = mysql_field_count(this->impl->mysql_handle);

			if ((mresult = mysql_store_result(this->impl->mysql_handle)) == 0)
			{
				if (num_fields == 0)
				{
					result.affected_rows = mysql_affected_rows(this->impl->mysql_handle);
					return result;
				}
				else
				{
					throw Database_QueryFailed(mysql_error(this->impl->mysql_handle));
				}
			}

			fields = mysql_fetch_fields(mresult);

			for (int i = 0; i < num_fields; ++i)
			{
				if (!fields[i].name)
				{
					throw Database_QueryFailed("libMySQL critical failure!");
				}
			}

			result.resize(mysql_num_rows(mresult));
			int i = 0;
			for (MYSQL_ROW row = mysql_fetch_row(mresult); row != 0; row = mysql_fetch_row(mresult))
			{
				std::unordered_map<std::string, util::variant> resrow;
				for (int ii = 0; ii < num_fields; ++ii)
				{
					util::variant rescell;
					if (IS_NUM(fields[ii].type))
					{
						if (row[ii])
						{
							rescell = util::to_int(row[ii]);
						}
						else
						{
							rescell = 0;
						}
					}
					else
					{
						if (row[ii])
						{
							rescell = row[ii];
						}
						else
						{
							rescell = "";
						}
					}
					resrow[fields[ii].name] = rescell;
				}
				result[i++] = resrow;
			}

			mysql_free_result(mresult);
		}
		break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
		case SQLite:
			if (sqlite3_exec(this->impl->sqlite_handle, query, sqlite_callback, (void *)this, 0) != SQLITE_OK)
			{
				throw Database_QueryFailed(sqlite3_errmsg(this->impl->sqlite_handle));
			}
			result = this->callbackdata;
			this->callbackdata.clear();
			break;
#endif // DATABASE_SQLITE

		default:
			throw Database_QueryFailed("Unknown database engine");
	}

	return result;
}